

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framebuffer.cpp
# Opt level: O2

void __thiscall image::Framebuffer::save_buffer(Framebuffer *this,string *name)

{
  ostream *poVar1;
  long lVar2;
  int x;
  long lVar3;
  int y;
  long lVar4;
  ofstream output;
  
  std::ofstream::ofstream((ostream *)&output,(string *)name,_S_trunc);
  poVar1 = std::operator<<((ostream *)&output,"P3");
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_width);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->m_height);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0xff);
  std::operator<<(poVar1,'\n');
  for (lVar4 = 0; lVar4 < this->m_height; lVar4 = lVar4 + 1) {
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < this->m_width; lVar3 = lVar3 + 1) {
      operator<<((ostream *)&output,(Color *)((long)&this->m_buffer[lVar4]->r + lVar2));
      lVar2 = lVar2 + 0x18;
    }
    std::operator<<((ostream *)&output,'\n');
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&output);
  return;
}

Assistant:

void image::Framebuffer::save_buffer(const std::string &name)
{
    std::ofstream output(name, std::ofstream::trunc);

    // standard P3 output
    output << "P3" << '\n' 
	   << m_width << ' ' << m_height << '\n' 
	   << 255 << '\n';
    for (int y = 0; y < m_height; y++)
    {
	for (int x = 0; x < m_width; x++)
	{
	    output << m_buffer[y][x];
	}
	output << '\n';
    }

    output.close();
}